

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

double __thiscall
HEkk::computeDualForTableauColumn(HEkk *this,HighsInt iVar,HVector *tableau_column)

{
  int iVar1;
  pointer pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  pdVar2 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = pdVar2[iVar];
  uVar4 = 0;
  uVar3 = (ulong)(uint)tableau_column->count;
  if (tableau_column->count < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = (tableau_column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar5 = dVar5 - (tableau_column->array).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1] *
                    pdVar2[(this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar1]];
  }
  return dVar5;
}

Assistant:

double HEkk::computeDualForTableauColumn(const HighsInt iVar,
                                         const HVector& tableau_column) {
  const vector<double>& workCost = info_.workCost_;
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;

  double dual = info_.workCost_[iVar];
  for (HighsInt i = 0; i < tableau_column.count; i++) {
    HighsInt iRow = tableau_column.index[i];
    dual -= tableau_column.array[iRow] * workCost[basicIndex[iRow]];
  }
  return dual;
}